

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverSymbols.cpp
# Opt level: O0

void __thiscall
slang::ast::addProperty
          (ast *this,Scope *scope,string_view name,VariableLifetime lifetime,
          StructBuilder *structBuilder)

{
  undefined4 in_register_00000084;
  Visibility local_44;
  ClassPropertySymbol *local_40;
  ClassPropertySymbol *prop;
  Compilation *comp;
  StructBuilder *structBuilder_local;
  Scope *pSStack_20;
  VariableLifetime lifetime_local;
  Scope *scope_local;
  string_view name_local;
  
  comp = (Compilation *)CONCAT44(in_register_00000084,lifetime);
  name_local._M_len = name._M_len;
  structBuilder_local._4_4_ = name._M_str._0_4_;
  pSStack_20 = (Scope *)this;
  scope_local = scope;
  prop = (ClassPropertySymbol *)Scope::getCompilation((Scope *)this);
  local_44 = Public;
  local_40 = BumpAllocator::
             emplace<slang::ast::ClassPropertySymbol,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation_const&,slang::ast::VariableLifetime&,slang::ast::Visibility>
                       ((BumpAllocator *)prop,
                        (basic_string_view<char,_std::char_traits<char>_> *)&scope_local,
                        (SourceLocation *)&SourceLocation::NoLocation,
                        (VariableLifetime *)((long)&structBuilder_local + 4),&local_44);
  ValueSymbol::setType((ValueSymbol *)local_40,(Type *)(comp->super_BumpAllocator).endPtr);
  Scope::addMember(pSStack_20,(Symbol *)local_40);
  return;
}

Assistant:

static void addProperty(Scope& scope, string_view name, VariableLifetime lifetime,
                        const StructBuilder& structBuilder) {
    auto& comp = scope.getCompilation();
    auto& prop = *comp.emplace<ClassPropertySymbol>(name, SourceLocation::NoLocation, lifetime,
                                                    Visibility::Public);
    prop.setType(structBuilder.type);
    scope.addMember(prop);
}